

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphValidator.cpp
# Opt level: O1

bool __thiscall
dg::pta::LLVMPointerGraphValidator::reportInvalOperands
          (LLVMPointerGraphValidator *this,PSNode *nd,string *user_err)

{
  long *plVar1;
  undefined1 uVar2;
  
  if ((nd->type == PHI) &&
     ((plVar1 = (long *)(nd->super_SubgraphNode<dg::pta::PSNode>).user_data,
      *(char *)(*plVar1 + 8) != '\x0f' ||
      ((((char)plVar1[2] == '\x14' && (nd->_parent != (PointerSubgraph *)0x0)) &&
       (nd->_parent->root->_parent == (PointerSubgraph *)0x0)))))) {
    return false;
  }
  uVar2 = dg::pta::PointerGraphValidator::reportInvalOperands((PSNode *)this,(string *)nd);
  return (bool)uVar2;
}

Assistant:

bool LLVMPointerGraphValidator::reportInvalOperands(
        const PSNode *nd, const std::string &user_err) {
    // just check whether the PHI is a pointer type. If it is a number,
    // we do not know whether it is an error.
    if (nd->getType() == PSNodeType::PHI) {
        const llvm::Value *val = getValue(nd);
        assert(val);

        if (val->getType()->isPointerTy()) {
            // this is the PHI node that corresponds to argv, we're fine here
            if (isa<llvm::Argument>(val) && nd->getParent() &&
                nd->getParent()->root->getParent() == nullptr)
                return false;

            return PointerGraphValidator::reportInvalOperands(nd, user_err);
        } // else issue a warning?
        return false;
    }

    return PointerGraphValidator::reportInvalOperands(nd, user_err);
}